

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_view_tests.cpp
# Opt level: O2

void __thiscall
iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test::Body
          (iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test *this)

{
  type **in_stack_fffffffffffffd68;
  iuCodeMessage local_290;
  StringViewConvertible v;
  StringViewConvertible local_240;
  string local_220;
  AssertionResult iutest_ar;
  LogChecker ck;
  iuStreamMessage local_190;
  
  LogChecker::LogChecker(&ck,"ABC");
  StringViewConvertible::StringViewConvertible(&v);
  iutest::PrintToString<StringViewConvertible>(&local_220,&v);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            (&iutest_ar,(internal *)"static_cast<const char*>(ck)","::iutest::PrintToString(v)",
             ck.super_LogCheckerBase.m_str._M_dataplus._M_p,(char *)&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
  std::__cxx11::string::~string((string *)&local_220);
  if (iutest_ar.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_290,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_view_tests.cpp"
               ,0x77,iutest_ar.m_message._M_dataplus._M_p);
    local_290._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_290,(Fixed *)&local_190);
    std::__cxx11::string::~string((string *)&local_290);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream(&local_190.m_stream);
  std::__cxx11::string::string((string *)&local_240,(string *)&v);
  iutest::detail::iuStreamMessage::operator<<(&local_190,&local_240);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_290,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_view_tests.cpp"
             ,0x78,"Succeeded.\n");
  local_290._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_290,(Fixed *)&local_190);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_240);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream(&local_190.m_stream);
  std::__cxx11::string::~string((string *)&v);
  LogChecker::~LogChecker(&ck);
  return;
}

Assistant:

IUTEST(UnitTest, PrintStringViewConvertible)
{
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
    LogChecker ck("ABC");
#else
    LogChecker ck("-Byte object");
#endif
    StringViewConvertible v;
    IUTEST_PRINTTOSTRING_CHECK(ck, v);
    IUTEST_STREAMOUT_CHECK(v);
}